

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

void deqp::gls::ub::anon_unknown_12::generateDeclaration
               (ostringstream *src,VarType *type,char *name,int indentLevel,deUint32 unusedHints)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  int *piVar6;
  vector<int,_std::allocator<int>_> arraySizes;
  PrecisionFlagsFmt local_5c;
  vector<int,_std::allocator<int>_> local_58;
  char *local_38;
  
  uVar2 = type->m_flags;
  local_38 = name;
  if ((uVar2 & 0xf8) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"layout(",7);
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)(CONCAT44(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,uVar2) & 0xffffffff000000f8);
    ub::operator<<((ostream *)src,(LayoutFlagsFmt *)&local_58);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,") ",2);
  }
  if ((uVar2 & 7) != 0) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)(CONCAT44(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,uVar2) & 0xffffffff00000007);
    ub::operator<<((ostream *)src,(PrecisionFlagsFmt *)&local_58);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src," ",1);
  }
  iVar1 = (int)src;
  if (type->m_type == TYPE_ARRAY) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
      local_5c.flags = (type->m_data).array.size;
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_5c);
      }
      else {
        *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_5c.flags;
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    if (type->m_type == TYPE_BASIC) {
      uVar2 = type->m_flags & 7;
      if (uVar2 != 0) {
        local_5c.flags = uVar2;
        ub::operator<<((ostream *)src,&local_5c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)src," ",1);
      }
      pcVar3 = glu::getDataTypeName((type->m_data).basicType);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)src + -0x18));
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,pcVar3,sVar4);
      }
    }
    else {
      generateLocalDeclaration(src,(type->m_data).structPtr,indentLevel + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src," ",1);
    pcVar3 = local_38;
    if (local_38 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)src + -0x18));
    }
    else {
      sVar4 = strlen(local_38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,pcVar3,sVar4);
    }
    piVar6 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"[",1);
        poVar5 = (ostream *)std::ostream::operator<<(src,*piVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
        piVar6 = piVar6 + 1;
      } while (piVar6 != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    goto LAB_00956364;
  }
  if (type->m_type == TYPE_BASIC) {
    pcVar3 = glu::getDataTypeName((type->m_data).basicType);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)src + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src," ",1);
    pcVar3 = local_38;
    if (local_38 == (char *)0x0) {
LAB_0095627c:
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)src + -0x18));
      goto LAB_00956364;
    }
    sVar4 = strlen(local_38);
  }
  else {
    generateLocalDeclaration(src,(type->m_data).structPtr,indentLevel + 1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src," ",1);
    pcVar3 = local_38;
    if (local_38 == (char *)0x0) goto LAB_0095627c;
    sVar4 = strlen(local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,pcVar3,sVar4);
LAB_00956364:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,";",1);
  if (unusedHints != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src," // unused in ",0xe);
    if (unusedHints == 0x400) {
      pcVar3 = "vertex shader";
    }
    else if (unusedHints == 0xc00) {
      pcVar3 = "both shaders";
    }
    else {
      pcVar3 = "???";
      if (unusedHints == 0x800) {
        pcVar3 = "fragment shader";
      }
    }
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)src,"\n",1);
  return;
}

Assistant:

void generateDeclaration (std::ostringstream& src, const VarType& type, const char* name, int indentLevel, deUint32 unusedHints)
{
	deUint32 flags = type.getFlags();

	if ((flags & LAYOUT_MASK) != 0)
		src << "layout(" << LayoutFlagsFmt(flags & LAYOUT_MASK) << ") ";

	if ((flags & PRECISION_MASK) != 0)
		src << PrecisionFlagsFmt(flags & PRECISION_MASK) << " ";

	if (type.isBasicType())
		src << glu::getDataTypeName(type.getBasicType()) << " " << name;
	else if (type.isArrayType())
	{
		std::vector<int>	arraySizes;
		const VarType*		curType		= &type;
		while (curType->isArrayType())
		{
			arraySizes.push_back(curType->getArraySize());
			curType = &curType->getElementType();
		}

		if (curType->isBasicType())
		{
			if ((curType->getFlags() & PRECISION_MASK) != 0)
				src << PrecisionFlagsFmt(curType->getFlags() & PRECISION_MASK) << " ";
			src << glu::getDataTypeName(curType->getBasicType());
		}
		else
		{
			DE_ASSERT(curType->isStructType());
			generateLocalDeclaration(src, curType->getStruct(), indentLevel+1);
		}

		src << " " << name;

		for (std::vector<int>::const_iterator sizeIter = arraySizes.begin(); sizeIter != arraySizes.end(); sizeIter++)
			src << "[" << *sizeIter << "]";
	}
	else
	{
		generateLocalDeclaration(src, type.getStruct(), indentLevel+1);
		src << " " << name;
	}

	src << ";";

	// Print out unused hints.
	if (unusedHints != 0)
		src << " // unused in " << (unusedHints == UNUSED_BOTH		? "both shaders"	:
									unusedHints == UNUSED_VERTEX	? "vertex shader"	:
									unusedHints == UNUSED_FRAGMENT	? "fragment shader" : "???");

	src << "\n";
}